

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::CreateMakeVariable
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *s,string *s2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer ppVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  size_type sVar7;
  mapped_type *pmVar8;
  allocator<char> local_201;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  uint local_15c;
  char local_155;
  int ni_1;
  string local_150 [3];
  char buffer_1 [5];
  string local_130 [32];
  undefined1 local_110 [8];
  string str2;
  string str1;
  int size;
  int keep;
  char local_a5 [5];
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char buffer [5];
  int ni;
  undefined1 local_88 [8];
  string ret;
  _Self local_60;
  iterator i;
  undefined1 local_48 [8];
  string unmodified;
  string *s2_local;
  string *s_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  unmodified.field_2._8_8_ = s2;
  std::__cxx11::string::string((string *)local_48,(string *)s);
  std::__cxx11::string::operator+=((string *)local_48,(string *)unmodified.field_2._8_8_);
  if ((((this->MakefileVariableSize == 0) &&
       (lVar5 = std::__cxx11::string::find((char)local_48,0x2e), lVar5 == -1)) &&
      (this->MakefileVariableSize == 0)) &&
     (((lVar5 = std::__cxx11::string::find((char)local_48,0x2b), lVar5 == -1 &&
       (this->MakefileVariableSize == 0)) &&
      (lVar5 = std::__cxx11::string::find((char)local_48,0x2d), lVar5 == -1)))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    i._M_node._0_4_ = 1;
    goto LAB_004c3eb8;
  }
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->MakeVariableMap,(key_type *)local_48);
  ret.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->MakeVariableMap);
  bVar1 = std::operator!=(&local_60,(_Self *)((long)&ret.field_2 + 8));
  if (bVar1) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar6->second);
    i._M_node._0_4_ = 1;
    goto LAB_004c3eb8;
  }
  std::__cxx11::string::string((string *)local_88,(string *)local_48);
  if (this->MakefileVariableSize == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    buffer[4] = '.';
    buffer[3] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,buffer + 4,buffer + 3);
    cmsys::SystemTools::ReplaceString((string *)local_88,"-","__");
    cmsys::SystemTools::ReplaceString((string *)local_88,"+","___");
    cStack_a0 = '\0';
    cStack_9f = '\0';
    cStack_9e = '\0';
    buffer[0] = '\0';
    while (sVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::count(&this->ShortMakeVariableMap,(key_type *)local_88),
          sVar7 != 0 && (int)_cStack_a0 < 1000) {
      _cStack_a0 = _cStack_a0 + 1;
      sprintf(local_a5,"%04d",(ulong)_cStack_a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     local_a5);
      std::__cxx11::string::operator=((string *)local_88,(string *)&size);
      std::__cxx11::string::~string((string *)&size);
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->ShortMakeVariableMap,(key_type *)local_88);
    std::__cxx11::string::operator=((string *)pmVar8,"1");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->MakeVariableMap,(key_type *)local_48);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_88);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_88);
    i._M_node._0_4_ = 1;
  }
  else {
    iVar2 = std::__cxx11::string::size();
    if (this->MakefileVariableSize < iVar2) {
      iVar2 = this->MakefileVariableSize;
      std::__cxx11::string::string((string *)(str2.field_2._M_local_buf + 8),(string *)s);
      std::__cxx11::string::string((string *)local_110,(string *)unmodified.field_2._8_8_);
      iVar3 = std::__cxx11::string::size();
      if (iVar2 + -8 < iVar3) {
        std::__cxx11::string::substr((ulong)local_130,(ulong)local_110);
        std::__cxx11::string::operator=((string *)local_110,local_130);
        std::__cxx11::string::~string(local_130);
      }
      iVar3 = std::__cxx11::string::size();
      iVar4 = std::__cxx11::string::size();
      if (iVar2 + -5 < iVar3 + iVar4) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_150,(ulong)((long)&str2.field_2 + 8));
        std::__cxx11::string::operator=((string *)(str2.field_2._M_local_buf + 8),local_150);
        std::__cxx11::string::~string(local_150);
      }
      local_15c = 0;
      sprintf(&local_155,"%04d",0);
      std::operator+(&local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&str2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
      ;
      std::operator+(&local_180,&local_1a0,&local_155);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      while (sVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::count(&this->ShortMakeVariableMap,(key_type *)local_88),
            sVar7 != 0 && (int)local_15c < 1000) {
        local_15c = local_15c + 1;
        sprintf(&local_155,"%04d",(ulong)local_15c);
        std::operator+(&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&str2.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
        std::operator+(&local_1c0,&local_1e0,&local_155);
        std::__cxx11::string::operator=((string *)local_88,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      bVar1 = local_15c != 1000;
      if (bVar1) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->ShortMakeVariableMap,(key_type *)local_88);
        std::__cxx11::string::operator=((string *)pmVar8,"1");
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"Borland makefile variable length too long",&local_201);
        cmSystemTools::Error(&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      }
      i._M_node._1_3_ = 0;
      i._M_node._0_1_ = !bVar1;
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(str2.field_2._M_local_buf + 8));
      if ((uint)i._M_node != 0) goto LAB_004c3ea2;
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->MakeVariableMap,(key_type *)local_48);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_88);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_88);
    i._M_node._0_4_ = 1;
  }
LAB_004c3ea2:
  std::__cxx11::string::~string((string *)local_88);
LAB_004c3eb8:
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::CreateMakeVariable(
  std::string const& s, std::string const& s2)
{
  std::string unmodified = s;
  unmodified += s2;
  // if there is no restriction on the length of make variables
  // and there are no "." characters in the string, then return the
  // unmodified combination.
  if ((!this->MakefileVariableSize &&
       unmodified.find('.') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('+') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('-') == std::string::npos)) {
    return unmodified;
  }

  // see if the variable has been defined before and return
  // the modified version of the variable
  std::map<std::string, std::string>::iterator i =
    this->MakeVariableMap.find(unmodified);
  if (i != this->MakeVariableMap.end()) {
    return i->second;
  }
  // start with the unmodified variable
  std::string ret = unmodified;
  // if this there is no value for this->MakefileVariableSize then
  // the string must have bad characters in it
  if (!this->MakefileVariableSize) {
    std::replace(ret.begin(), ret.end(), '.', '_');
    cmSystemTools::ReplaceString(ret, "-", "__");
    cmSystemTools::ReplaceString(ret, "+", "___");
    int ni = 0;
    char buffer[5];
    // make sure the _ version is not already used, if
    // it is used then add number to the end of the variable
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = unmodified + buffer;
    }
    this->ShortMakeVariableMap[ret] = "1";
    this->MakeVariableMap[unmodified] = ret;
    return ret;
  }

  // if the string is greater than 32 chars it is an invalid variable name
  // for borland make
  if (static_cast<int>(ret.size()) > this->MakefileVariableSize) {
    int keep = this->MakefileVariableSize - 8;
    int size = keep + 3;
    std::string str1 = s;
    std::string str2 = s2;
    // we must shorten the combined string by 4 characters
    // keep no more than 24 characters from the second string
    if (static_cast<int>(str2.size()) > keep) {
      str2 = str2.substr(0, keep);
    }
    if (static_cast<int>(str1.size()) + static_cast<int>(str2.size()) > size) {
      str1 = str1.substr(0, size - str2.size());
    }
    char buffer[5];
    int ni = 0;
    sprintf(buffer, "%04d", ni);
    ret = str1 + str2 + buffer;
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = str1 + str2 + buffer;
    }
    if (ni == 1000) {
      cmSystemTools::Error("Borland makefile variable length too long");
      return unmodified;
    }
    // once an unused variable is found
    this->ShortMakeVariableMap[ret] = "1";
  }
  // always make an entry into the unmodified to variable map
  this->MakeVariableMap[unmodified] = ret;
  return ret;
}